

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O0

Event * ftxui::Event::Special(Event *__return_storage_ptr__,string *input)

{
  string *input_local;
  Event *event;
  
  Event(__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->input_,(string *)input);
  return __return_storage_ptr__;
}

Assistant:

Event Event::Special(std::string input) {
  Event event;
  event.input_ = std::move(input);
  return event;
}